

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld)

{
  sColMap *psVar1;
  u8 uVar2;
  char cVar3;
  u8 uVar4;
  sqlite3 *psVar5;
  undefined1 uVar6;
  int iVar7;
  FKey *pFKey;
  sColMap *psVar8;
  Expr *pEVar9;
  Expr *pEVar10;
  Expr *pRight;
  char *pcVar11;
  ExprList *pEList;
  SrcList *pSrc;
  Schema *pSVar12;
  Select *pSVar13;
  long lVar14;
  uint uVar15;
  Trigger *p;
  Token tOld;
  int *aiCol;
  Token tNew;
  Token tToCol;
  Index *pIdx;
  Token tFromCol;
  Expr *local_e0;
  Expr *local_d8;
  Select *local_c8;
  ExprList *local_c0;
  Token local_a8;
  sqlite3 *local_98;
  int *local_90;
  Token local_88;
  TriggerStep *local_78;
  ulong local_70;
  Token local_68;
  Index *local_58;
  char *local_50;
  FKey *local_48;
  Token local_40;
  
  if (((pParse->db->flags & 0x40000) != 0) &&
     (pFKey = sqlite3FkReferences(pTab), pFKey != (FKey *)0x0)) {
    local_70 = (ulong)(pChanges != (ExprList *)0x0);
    do {
      uVar2 = pFKey->aAction[local_70];
      p = pFKey->apTrigger[local_70];
      if (p == (Trigger *)0x0 && uVar2 != '\0') {
        psVar5 = pParse->db;
        local_58 = (Index *)0x0;
        local_90 = (int *)0x0;
        iVar7 = sqlite3FkLocateIndex(pParse,pTab,pFKey,&local_58,&local_90);
        p = (Trigger *)0x0;
        if (iVar7 == 0) {
          local_98 = psVar5;
          if (pFKey->nCol < 1) {
            local_e0 = (Expr *)0x0;
            local_c0 = (ExprList *)0x0;
            local_d8 = (Expr *)0x0;
          }
          else {
            psVar1 = pFKey->aCol;
            lVar14 = 0;
            local_d8 = (Expr *)0x0;
            local_c0 = (ExprList *)0x0;
            local_e0 = (Expr *)0x0;
            local_48 = pFKey;
            do {
              local_a8.z = "old";
              local_a8.n = 3;
              local_a8._12_4_ = 0;
              psVar8 = (sColMap *)(local_90 + lVar14);
              if (local_90 == (int *)0x0) {
                psVar8 = psVar1;
              }
              local_88.z = "new";
              local_88.n = 3;
              local_88._12_4_ = 0;
              local_68.z = "oid";
              if (local_58 != (Index *)0x0) {
                local_68.z = pTab->aCol[local_58->aiColumn[lVar14]].zName;
              }
              iVar7 = psVar8->iFrom;
              local_40.z = pFKey->pFrom->aCol[iVar7].zName;
              local_40.n = 0;
              local_68.n = 0;
              if (local_68.z != (char *)0x0) {
                local_68.n = 0xffffffff;
                pcVar11 = local_68.z;
                do {
                  local_68.n = local_68.n + 1;
                  cVar3 = *pcVar11;
                  pcVar11 = pcVar11 + 1;
                } while (cVar3 != '\0');
                local_68.n = local_68.n & 0x3fffffff;
              }
              if (local_40.z != (char *)0x0) {
                local_40.n = 0xffffffff;
                pcVar11 = local_40.z;
                do {
                  local_40.n = local_40.n + 1;
                  cVar3 = *pcVar11;
                  pcVar11 = pcVar11 + 1;
                } while (cVar3 != '\0');
                local_40.n = local_40.n & 0x3fffffff;
              }
              pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_a8);
              pEVar10 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_68);
              pEVar9 = sqlite3PExpr(pParse,0x76,pEVar9,pEVar10,(Token *)0x0);
              pEVar10 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_40);
              pEVar9 = sqlite3PExpr(pParse,0x4c,pEVar9,pEVar10,(Token *)0x0);
              psVar5 = local_98;
              local_e0 = sqlite3ExprAnd(local_98,local_e0,pEVar9);
              if (pChanges != (ExprList *)0x0) {
                pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_a8);
                pEVar10 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_68);
                pEVar9 = sqlite3PExpr(pParse,0x76,pEVar9,pEVar10,(Token *)0x0);
                pEVar10 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_88);
                pRight = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_68);
                pEVar10 = sqlite3PExpr(pParse,0x76,pEVar10,pRight,(Token *)0x0);
                pEVar9 = sqlite3PExpr(pParse,0x46,pEVar9,pEVar10,(Token *)0x0);
                local_d8 = sqlite3ExprAnd(psVar5,local_d8,pEVar9);
              }
              pFKey = local_48;
              if ((uVar2 != '\t' || pChanges != (ExprList *)0x0) && uVar2 != '\x06') {
                if (uVar2 == '\b') {
                  pEVar9 = local_48->pFrom->aCol[iVar7].pDflt;
                  if (pEVar9 == (Expr *)0x0) goto LAB_0019b226;
                  pEVar9 = exprDup(local_98,pEVar9,0,(u8 **)0x0);
                }
                else {
                  if (uVar2 == '\t') {
                    pEVar9 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_88);
                    pEVar10 = sqlite3PExpr(pParse,0x1a,(Expr *)0x0,(Expr *)0x0,&local_68);
                    iVar7 = 0x76;
                  }
                  else {
LAB_0019b226:
                    iVar7 = 0x62;
                    pEVar9 = (Expr *)0x0;
                    pEVar10 = (Expr *)0x0;
                  }
                  pEVar9 = sqlite3PExpr(pParse,iVar7,pEVar9,pEVar10,(Token *)0x0);
                }
                local_c0 = sqlite3ExprListAppend(pParse,local_c0,pEVar9);
                sqlite3ExprListSetName(pParse,local_c0,&local_40,0);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < pFKey->nCol);
          }
          psVar5 = local_98;
          sqlite3DbFree(local_98,local_90);
          local_50 = pFKey->pFrom->zName;
          if (local_50 == (char *)0x0) {
            uVar15 = 0;
          }
          else {
            uVar15 = 0xffffffff;
            pcVar11 = local_50;
            do {
              uVar15 = uVar15 + 1;
              cVar3 = *pcVar11;
              pcVar11 = pcVar11 + 1;
            } while (cVar3 != '\0');
            uVar15 = uVar15 & 0x3fffffff;
          }
          if (uVar2 == '\x06') {
            local_88.n = uVar15;
            local_a8.z = "foreign key constraint failed";
            local_a8.n = 0x1d;
            local_88.z = local_50;
            pEVar9 = sqlite3ExprAlloc(psVar5,0x38,&local_a8,0);
            if (pEVar9 != (Expr *)0x0) {
              pEVar9->affinity = '\x02';
            }
            pEList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar9);
            pSrc = sqlite3SrcListAppend(psVar5,(SrcList *)0x0,&local_88,(Token *)0x0);
            local_c8 = sqlite3SelectNew(pParse,pEList,pSrc,local_e0,(ExprList *)0x0,(Expr *)0x0,
                                        (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
            local_e0 = (Expr *)0x0;
          }
          else {
            local_c8 = (Select *)0x0;
          }
          uVar4 = (psVar5->lookaside).bEnabled;
          (psVar5->lookaside).bEnabled = '\0';
          p = (Trigger *)sqlite3DbMallocRaw(psVar5,uVar15 + 0x99);
          if (p == (Trigger *)0x0) {
            local_78 = (TriggerStep *)0x0;
          }
          else {
            memset(p,0,(ulong)(uVar15 + 0x99));
            local_78 = (TriggerStep *)(p + 1);
            p->step_list = local_78;
            p[1].pWhen = (Expr *)&p[2].table;
            *(uint *)&p[1].pColumns = uVar15;
            memcpy(&p[2].table,local_50,(ulong)uVar15);
            pSVar12 = (Schema *)exprDup(psVar5,local_e0,1,(u8 **)0x0);
            p[1].pSchema = pSVar12;
            pSVar12 = (Schema *)sqlite3ExprListDup(psVar5,local_c0,1);
            p[1].pTabSchema = pSVar12;
            pSVar13 = sqlite3SelectDup(psVar5,local_c8,1);
            *(Select **)&p[1].op = pSVar13;
            if (local_d8 == (Expr *)0x0) {
              local_d8 = (Expr *)0x0;
            }
            else {
              local_d8 = sqlite3PExpr(pParse,0x13,local_d8,(Expr *)0x0,(Token *)0x0);
              pEVar9 = exprDup(psVar5,local_d8,1,(u8 **)0x0);
              p->pWhen = pEVar9;
            }
          }
          (psVar5->lookaside).bEnabled = uVar4;
          sqlite3ExprDelete(psVar5,local_e0);
          sqlite3ExprDelete(psVar5,local_d8);
          sqlite3ExprListDelete(psVar5,local_c0);
          sqlite3SelectDelete(psVar5,local_c8);
          if (psVar5->mallocFailed == '\x01') {
            fkTriggerDelete(psVar5,p);
            p = (Trigger *)0x0;
          }
          else {
            if (uVar2 == '\x06') {
              uVar6 = 0x74;
            }
            else if ((uVar2 == '\t') && (pChanges == (ExprList *)0x0)) {
              uVar6 = 0x6a;
            }
            else {
              uVar6 = 0x6b;
            }
            local_78->op = uVar6;
            local_78->pTrig = p;
            pSVar12 = pTab->pSchema;
            p->pSchema = pSVar12;
            p->pTabSchema = pSVar12;
            pFKey->apTrigger[local_70] = p;
            p->op = pChanges != (ExprList *)0x0 | 0x6a;
          }
        }
      }
      if (p != (Trigger *)0x0) {
        sqlite3CodeRowTriggerDirect(pParse,p,pTab,regOld,2,0);
      }
      pFKey = pFKey->pNextTo;
    } while (pFKey != (FKey *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld                      /* Address of array containing old row */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      Trigger *pAction = fkActionTrigger(pParse, pTab, pFKey, pChanges);
      if( pAction ){
        sqlite3CodeRowTriggerDirect(pParse, pAction, pTab, regOld, OE_Abort, 0);
      }
    }
  }
}